

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O3

string * leveldb::test::TmpDir_abi_cxx11_(void)

{
  Env *pEVar1;
  Tester *this;
  string *in_RDI;
  Status s;
  Status local_1e0;
  string local_1d8;
  Tester local_1b8;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  pEVar1 = Env::Default();
  (*pEVar1->_vptr_Env[0x11])(&local_1e0,pEVar1);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/testharness.cc"
  ;
  local_1b8.line_ = 0x43;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  this = Tester::Is(&local_1b8,local_1e0.state_ == (char *)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_1d8,&local_1e0);
  Tester::operator<<(this,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  Tester::~Tester(&local_1b8);
  if (local_1e0.state_ != (char *)0x0) {
    operator_delete__(local_1e0.state_);
  }
  return in_RDI;
}

Assistant:

std::string TmpDir() {
  std::string dir;
  Status s = Env::Default()->GetTestDirectory(&dir);
  ASSERT_TRUE(s.ok()) << s.ToString();
  return dir;
}